

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int sasl_mechanism_in_list(amqp_bytes_t mechanisms,amqp_sasl_method_enum method)

{
  amqp_bytes_t l;
  int iVar1;
  void *pvVar2;
  void *in_RSI;
  long in_RDI;
  amqp_bytes_t aVar3;
  uint8_t *current;
  uint8_t *end;
  uint8_t *start;
  amqp_bytes_t supported_mechanism;
  amqp_bytes_t mechanism;
  void *pvVar4;
  void *pvVar5;
  void *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  
  aVar3 = sasl_method_name((amqp_sasl_method_enum)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  pvVar4 = (void *)aVar3.len;
  pvVar5 = aVar3.bytes;
  pvVar2 = (void *)((long)in_RSI + in_RDI);
  local_48 = in_RSI;
  while( true ) {
    if (in_RSI == pvVar2) {
      return 0;
    }
    in_RSI = memchr(local_48,0x20,(long)pvVar2 - (long)local_48);
    if (in_RSI == (void *)0x0) {
      in_RSI = pvVar2;
    }
    l.bytes = in_RSI;
    l.len = (size_t)pvVar5;
    aVar3.bytes = pvVar4;
    aVar3.len = 0x112ef3;
    iVar1 = bytes_equal(l,aVar3);
    if (iVar1 != 0) break;
    local_48 = (void *)((long)in_RSI + 1);
  }
  return 1;
}

Assistant:

int sasl_mechanism_in_list(amqp_bytes_t mechanisms,
                           amqp_sasl_method_enum method) {
  amqp_bytes_t mechanism;
  amqp_bytes_t supported_mechanism;
  uint8_t *start;
  uint8_t *end;
  uint8_t *current;

  assert(NULL != mechanisms.bytes);

  mechanism = sasl_method_name(method);

  start = (uint8_t *)mechanisms.bytes;
  current = start;
  end = start + mechanisms.len;

  for (; current != end; start = current + 1) {
    /* HACK: SASL states that we should be parsing this string as a UTF-8
     * string, which we're plainly not doing here. At this point its not worth
     * dragging an entire UTF-8 parser for this one case, and this should work
     * most of the time */
    current = memchr(start, ' ', end - start);
    if (NULL == current) {
      current = end;
    }
    supported_mechanism.bytes = start;
    supported_mechanism.len = current - start;
    if (bytes_equal(mechanism, supported_mechanism)) {
      return 1;
    }
  }

  return 0;
}